

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O1

FT_Error raccess_guess_linux_double_from_file_name
                   (FT_Library library,char *file_name,FT_Long *result_offset)

{
  FT_Module pFVar1;
  FT_Error FVar2;
  FT_Int32 in_ECX;
  FT_Long *in_R8;
  FT_Stream stream2;
  FT_Open_Args args2;
  FT_Library local_60;
  FT_Open_Args local_58;
  
  local_58.flags = 4;
  local_58.pathname = file_name;
  FVar2 = FT_Stream_New(library,&local_58,(FT_Stream *)&local_60);
  if (FVar2 == 0) {
    if (local_60 == (FT_Library)0x0) {
      FVar2 = 0x51;
    }
    else {
      FVar2 = raccess_guess_apple_generic
                        (local_60,(FT_Stream)&DAT_00051607,(char *)result_offset,in_ECX,in_R8);
      pFVar1 = local_60->modules[4];
      if (local_60->modules[3] != (FT_Module)0x0) {
        (*(code *)local_60->modules[3])(local_60);
      }
      (*(code *)pFVar1->memory)(pFVar1,local_60);
    }
  }
  return FVar2;
}

Assistant:

static FT_Error
  raccess_guess_linux_double_from_file_name( FT_Library  library,
                                             char       *file_name,
                                             FT_Long    *result_offset )
  {
    FT_Open_Args  args2;
    FT_Stream     stream2;
    char*         nouse = NULL;
    FT_Error      error;


    args2.flags    = FT_OPEN_PATHNAME;
    args2.pathname = file_name;
    error = FT_Stream_New( library, &args2, &stream2 );
    if ( error )
      return error;

    error = raccess_guess_apple_double( library, stream2, file_name,
                                        &nouse, result_offset );

    FT_Stream_Free( stream2, 0 );

    return error;
  }